

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm_suite.cpp
# Opt level: O3

void insertion_sort_suite::sort_1234_predicate(void)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int __tmp;
  long lVar4;
  array<int,_4UL> storage;
  array<int,_4UL> expect;
  int local_8 [2];
  
  storage._M_elems[0] = 0xb;
  storage._M_elems[1] = 0x16;
  storage._M_elems[2] = 0x21;
  storage._M_elems[3] = 0x2c;
  lVar3 = 0;
  do {
    if (lVar3 != 0) {
      iVar1 = *(int *)((long)storage._M_elems + lVar3);
      lVar4 = lVar3;
      do {
        iVar2 = *(int *)((long)expect._M_elems + lVar4 + -0x14);
        if (iVar1 <= iVar2) break;
        *(int *)((long)storage._M_elems + lVar4) = iVar2;
        *(int *)((long)expect._M_elems + lVar4 + -0x14) = iVar1;
        lVar4 = lVar4 + -4;
      } while (lVar4 != 0);
    }
    lVar3 = lVar3 + 4;
    if (lVar3 == 0x10) {
      expect._M_elems[0] = 0x2c;
      expect._M_elems[1] = 0x21;
      expect._M_elems[2] = 0x16;
      expect._M_elems[3] = 0xb;
      boost::detail::test_all_eq_impl<std::ostream,int*,int*>
                ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
                 ,0x5a1,"void insertion_sort_suite::sort_1234_predicate()",storage._M_elems,
                 expect._M_elems,expect._M_elems,local_8);
      return;
    }
  } while( true );
}

Assistant:

void sort_1234_predicate()
{
    std::array<int, 4> storage = { 11, 22, 33, 44 };
    insertion_sort(storage.begin(), storage.end(), vista::greater<int>{});
    {
        std::array<int, 4> expect = { 44, 33, 22, 11 };
        BOOST_TEST_ALL_EQ(storage.begin(), storage.end(),
                          expect.begin(), expect.end());
    }
}